

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int inter_mode_search_order_independent_skip
              (AV1_COMP *cpi,MACROBLOCK *x,mode_skip_mask_t *mode_skip_mask,
              InterModeSearchState *search_state,int skip_ref_frame_mask,PREDICTION_MODE mode,
              MV_REFERENCE_FRAME *ref_frame)

{
  PREDICTION_MODE mode_00;
  char cVar1;
  long lVar2;
  _Bool _Var3;
  byte bVar4;
  int ref_frame_00;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  long *in_RCX;
  mode_skip_mask_t *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  PREDICTION_MODE in_R9B;
  bool bVar9;
  uint skip_intra_var_thresh;
  int skip_ref;
  int skip_motion_mode;
  int num_ref_frame_pair_match;
  int num_ref_frame_pair_match_thresh;
  int qindex_sub_range;
  int thresholds [3] [3];
  MACROBLOCKD *xd;
  SPEED_FEATURES *sf;
  MB_MODE_INFO *mbmi;
  int skip_motion_mode_only;
  int mode_is_single;
  int cached_mode_is_single;
  MV_REFERENCE_FRAME *cached_frame;
  PREDICTION_MODE cached_mode;
  MB_MODE_INFO *cached_mi;
  AV1_COMMON *cm;
  int ref_type;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  undefined4 in_stack_ffffffffffffff40;
  MV_REFERENCE_FRAME ref_frame_01;
  uint local_bc;
  undefined4 in_stack_ffffffffffffff4c;
  MV_REFERENCE_FRAME ref_frame_02;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  PREDICTION_MODE in_stack_ffffffffffffff6f;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  AV1_COMMON *in_stack_ffffffffffffff78;
  uint local_64;
  int local_4;
  
  ref_frame_02 = (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffff4c >> 0x18);
  ref_frame_01 = (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffff40 >> 0x18);
  _Var3 = mask_says_skip(in_RDX,_skip_intra_var_thresh,in_R9B);
  if (_Var3) {
    local_4 = 1;
  }
  else {
    bVar4 = av1_ref_frame_type((MV_REFERENCE_FRAME *)
                               CONCAT17(in_stack_ffffffffffffff3f,
                                        CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38
                                                )));
    ref_frame_00 = (int)(char)bVar4;
    if ((*(int *)(in_RDI + 0x60cc8) == 0) &&
       (iVar5 = prune_ref_frame((AV1_COMP *)
                                CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                (MACROBLOCK *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                ref_frame_02), iVar5 != 0)) {
      local_4 = 1;
    }
    else if ((*(int *)(in_RDI + 0x426dc) == 0) || (*_skip_intra_var_thresh != '\0')) {
      iVar5 = skip_repeated_mv(in_stack_ffffffffffffff78,
                               (MACROBLOCK *)
                               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                               in_stack_ffffffffffffff6f,
                               (MV_REFERENCE_FRAME *)
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                               (InterModeSearchState *)
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      if (iVar5 == 0) {
        if (*(int *)(in_RSI + 0x1f6a8) != 0) {
          lVar2 = *(long *)(in_RSI + 0x1f6b0);
          mode_00 = *(PREDICTION_MODE *)(lVar2 + 2);
          pcVar8 = (char *)(lVar2 + 0x10);
          cVar1 = *(char *)(lVar2 + 0x11);
          iVar5 = is_mode_intra(mode_00);
          if ((iVar5 != 0) && (in_R9B != mode_00)) {
            return 1;
          }
          if (cVar1 < '\x01') {
            if ((in_R9B != mode_00) || (*_skip_intra_var_thresh != *pcVar8)) {
              return 1;
            }
          }
          else {
            if (_skip_intra_var_thresh[1] < '\x01') {
              local_64 = 0;
              if ((mode_00 == '\x16') || (mode_00 == '\x14')) {
                local_64 = (uint)(*_skip_intra_var_thresh == *pcVar8);
              }
              else if ((mode_00 == '\x15') || (mode_00 == '\x13')) {
                local_64 = (uint)(*_skip_intra_var_thresh == *(char *)(lVar2 + 0x11));
              }
              else if (mode_00 == '\x18') {
                bVar9 = true;
                if (*_skip_intra_var_thresh != *pcVar8) {
                  bVar9 = *_skip_intra_var_thresh == *(char *)(lVar2 + 0x11);
                }
                local_64 = (uint)bVar9;
              }
              return local_64 + 1;
            }
            if (((in_R9B != mode_00) || (*_skip_intra_var_thresh != *pcVar8)) ||
               (_skip_intra_var_thresh[1] != *(char *)(lVar2 + 0x11))) {
              return 1;
            }
          }
        }
        lVar2 = **(long **)(in_RSI + 0x2058);
        if (((*in_RCX == 0x7fffffffffffffff) && (*(char *)(lVar2 + 1) == '\0')) &&
           (*(int *)(in_RSI + 0x18c0c) != 0)) {
          local_4 = 0;
        }
        else {
          if (((*(char *)(in_RDI + 0x60b10) != '\0') &&
              (((in_R9B == '\x12' || (in_R9B == '\x0e')) && (*in_RCX != 0x7fffffffffffffff)))) &&
             (((*(byte *)(in_RSI + 0x2061) & 1) != 0 && ((*(byte *)(in_RSI + 0x2060) & 1) != 0)))) {
            memset(&stack0xffffffffffffff58,0,0x24);
            iVar5 = *(int *)(&stack0xffffffffffffff58 +
                            (long)((*(int *)(in_RSI + 0x4208) * 3) / 0x100) * 4 +
                            (long)(int)(*(byte *)(in_RDI + 0x60b10) - 1) * 0xc);
            iVar6 = match_ref_frame_pair(*(MB_MODE_INFO **)(in_RSI + 0x2068),_skip_intra_var_thresh)
            ;
            iVar7 = match_ref_frame_pair(*(MB_MODE_INFO **)(in_RSI + 0x2070),_skip_intra_var_thresh)
            ;
            if (iVar7 + iVar6 < iVar5) {
              return 1;
            }
          }
          bVar9 = false;
          if (*(char *)(lVar2 + 1) != '\0') {
            local_bc = in_R8D & 1 << (bVar4 & 0x1f);
            if ((ref_frame_00 < 8) && (local_bc != 0)) {
              iVar5 = is_ref_frame_used_by_compound_ref(ref_frame_00,in_R8D);
              bVar9 = iVar5 != 0;
              if (bVar9) {
                local_bc = 0;
              }
            }
            iVar5 = is_ref_frame_used_in_cache
                              (ref_frame_01,
                               (MB_MODE_INFO *)
                               CONCAT17(in_stack_ffffffffffffff3f,
                                        CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38
                                                )));
            if (iVar5 != 0) {
              local_bc = 0;
              bVar9 = false;
              if (ref_frame_00 < 8) {
                bVar9 = '\0' < *(char *)(*(long *)(in_RSI + 0x1f6b0) + 0x11);
              }
            }
            if (local_bc != 0) {
              return 1;
            }
          }
          if ((((*_skip_intra_var_thresh == '\0') && (in_R9B != '\0')) &&
              ((*(uint *)(in_RDI + 0x60ca8) & 0x20) != 0)) && (*(uint *)(in_RSI + 0x25640) < 0x40))
          {
            local_4 = 1;
          }
          else if (bVar9) {
            local_4 = 2;
          }
          else {
            local_4 = 0;
          }
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int inter_mode_search_order_independent_skip(
    const AV1_COMP *cpi, const MACROBLOCK *x, mode_skip_mask_t *mode_skip_mask,
    InterModeSearchState *search_state, int skip_ref_frame_mask,
    PREDICTION_MODE mode, const MV_REFERENCE_FRAME *ref_frame) {
  if (mask_says_skip(mode_skip_mask, ref_frame, mode)) {
    return 1;
  }

  const int ref_type = av1_ref_frame_type(ref_frame);
  if (!cpi->sf.rt_sf.use_real_time_ref_set)
    if (prune_ref_frame(cpi, x, ref_type)) return 1;

  // This is only used in motion vector unit test.
  if (cpi->oxcf.unit_test_cfg.motion_vector_unit_test &&
      ref_frame[0] == INTRA_FRAME)
    return 1;

  const AV1_COMMON *const cm = &cpi->common;
  if (skip_repeated_mv(cm, x, mode, ref_frame, search_state)) {
    return 1;
  }

  // Reuse the prediction mode in cache
  if (x->use_mb_mode_cache) {
    const MB_MODE_INFO *cached_mi = x->mb_mode_cache;
    const PREDICTION_MODE cached_mode = cached_mi->mode;
    const MV_REFERENCE_FRAME *cached_frame = cached_mi->ref_frame;
    const int cached_mode_is_single = cached_frame[1] <= INTRA_FRAME;

    // If the cached mode is intra, then we just need to match the mode.
    if (is_mode_intra(cached_mode) && mode != cached_mode) {
      return 1;
    }

    // If the cached mode is single inter mode, then we match the mode and
    // reference frame.
    if (cached_mode_is_single) {
      if (mode != cached_mode || ref_frame[0] != cached_frame[0]) {
        return 1;
      }
    } else {
      // If the cached mode is compound, then we need to consider several cases.
      const int mode_is_single = ref_frame[1] <= INTRA_FRAME;
      if (mode_is_single) {
        // If the mode is single, we know the modes can't match. But we might
        // still want to search it if compound mode depends on the current mode.
        int skip_motion_mode_only = 0;
        if (cached_mode == NEW_NEARMV || cached_mode == NEW_NEARESTMV) {
          skip_motion_mode_only = (ref_frame[0] == cached_frame[0]);
        } else if (cached_mode == NEAR_NEWMV || cached_mode == NEAREST_NEWMV) {
          skip_motion_mode_only = (ref_frame[0] == cached_frame[1]);
        } else if (cached_mode == NEW_NEWMV) {
          skip_motion_mode_only = (ref_frame[0] == cached_frame[0] ||
                                   ref_frame[0] == cached_frame[1]);
        }

        return 1 + skip_motion_mode_only;
      } else {
        // If both modes are compound, then everything must match.
        if (mode != cached_mode || ref_frame[0] != cached_frame[0] ||
            ref_frame[1] != cached_frame[1]) {
          return 1;
        }
      }
    }
  }

  const MB_MODE_INFO *const mbmi = x->e_mbd.mi[0];
  // If no valid mode has been found so far in PARTITION_NONE when finding a
  // valid partition is required, do not skip mode.
  if (search_state->best_rd == INT64_MAX && mbmi->partition == PARTITION_NONE &&
      x->must_find_valid_partition)
    return 0;

  const SPEED_FEATURES *const sf = &cpi->sf;
  // Prune NEARMV and NEAR_NEARMV based on q index and neighbor's reference
  // frames
  if (sf->inter_sf.prune_nearmv_using_neighbors &&
      (mode == NEAR_NEARMV || mode == NEARMV)) {
    const MACROBLOCKD *const xd = &x->e_mbd;
    if (search_state->best_rd != INT64_MAX && xd->left_available &&
        xd->up_available) {
      const int thresholds[PRUNE_NEARMV_MAX][3] = { { 1, 0, 0 },
                                                    { 1, 1, 0 },
                                                    { 2, 1, 0 } };
      const int qindex_sub_range = x->qindex * 3 / QINDEX_RANGE;

      assert(sf->inter_sf.prune_nearmv_using_neighbors <= PRUNE_NEARMV_MAX &&
             qindex_sub_range < 3);
      const int num_ref_frame_pair_match_thresh =
          thresholds[sf->inter_sf.prune_nearmv_using_neighbors - 1]
                    [qindex_sub_range];

      assert(num_ref_frame_pair_match_thresh <= 2 &&
             num_ref_frame_pair_match_thresh >= 0);
      int num_ref_frame_pair_match = 0;

      num_ref_frame_pair_match = match_ref_frame_pair(xd->left_mbmi, ref_frame);
      num_ref_frame_pair_match +=
          match_ref_frame_pair(xd->above_mbmi, ref_frame);

      // Pruning based on ref frame pair match with neighbors.
      if (num_ref_frame_pair_match < num_ref_frame_pair_match_thresh) return 1;
    }
  }

  int skip_motion_mode = 0;
  if (mbmi->partition != PARTITION_NONE) {
    int skip_ref = skip_ref_frame_mask & (1 << ref_type);
    if (ref_type <= ALTREF_FRAME && skip_ref) {
      // Since the compound ref modes depends on the motion estimation result of
      // two single ref modes (best mv of single ref modes as the start point),
      // if current single ref mode is marked skip, we need to check if it will
      // be used in compound ref modes.
      if (is_ref_frame_used_by_compound_ref(ref_type, skip_ref_frame_mask)) {
        // Found a not skipped compound ref mode which contains current
        // single ref. So this single ref can't be skipped completely
        // Just skip its motion mode search, still try its simple
        // transition mode.
        skip_motion_mode = 1;
        skip_ref = 0;
      }
    }
    // If we are reusing the prediction from cache, and the current frame is
    // required by the cache, then we cannot prune it.
    if (is_ref_frame_used_in_cache(ref_type, x->mb_mode_cache)) {
      skip_ref = 0;
      // If the cache only needs the current reference type for compound
      // prediction, then we can skip motion mode search.
      skip_motion_mode = (ref_type <= ALTREF_FRAME &&
                          x->mb_mode_cache->ref_frame[1] > INTRA_FRAME);
    }
    if (skip_ref) return 1;
  }

  if (ref_frame[0] == INTRA_FRAME) {
    if (mode != DC_PRED) {
      // Disable intra modes other than DC_PRED for blocks with low variance
      // Threshold for intra skipping based on source variance
      // TODO(debargha): Specialize the threshold for super block sizes
      const unsigned int skip_intra_var_thresh = 64;
      if ((sf->rt_sf.mode_search_skip_flags & FLAG_SKIP_INTRA_LOWVAR) &&
          x->source_variance < skip_intra_var_thresh)
        return 1;
    }
  }

  if (skip_motion_mode) return 2;

  return 0;
}